

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QGraphicsItemCache * __thiscall QGraphicsItemPrivate::extraItemCache(QGraphicsItemPrivate *this)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  QMetaType QVar4;
  pointer pEVar5;
  ulong uVar6;
  ExtraStruct *pEVar7;
  QVariant *pQVar8;
  QMetaType mt;
  PrivateShared *pPVar9;
  long in_FS_OFFSET;
  QMetaType local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 local_58 [48];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->extras).d.size;
  if (lVar3 != 0) {
    pQVar8 = &((this->extras).d.ptr)->value;
    do {
      if (*(int *)&pQVar8[-1].d.field_0x18 == 2) {
        ::QVariant::QVariant((QVariant *)local_58,pQVar8);
        local_80.d_ptr = (QMetaTypeInterface *)(local_58._24_8_ & 0xfffffffffffffffc);
        goto LAB_005daab5;
      }
      pQVar8 = (QVariant *)((long)&pQVar8[1].d.data + 8);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  local_58._0_16_ = (undefined1  [16])0x0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 2;
  local_80.d_ptr = (QMetaTypeInterface *)0x0;
LAB_005daab5:
  local_78.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType;
  bVar2 = comparesEqual(&local_80,(QMetaType *)&local_78.shared);
  if (bVar2) {
    QVar4.d_ptr = (QMetaTypeInterface *)local_58._0_8_;
    if ((local_58._24_8_ & 1) != 0) {
      QVar4.d_ptr = *(QMetaTypeInterface **)(local_58._0_8_ + (long)*(int *)(local_58._0_8_ + 4));
    }
  }
  else {
    local_80.d_ptr = (QMetaTypeInterface *)0x0;
    pPVar9 = (PrivateShared *)local_58;
    QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_58._24_8_ & 1) != 0) {
      pPVar9 = (PrivateShared *)(local_58._0_8_ + (long)*(int *)(local_58._0_8_ + 4));
    }
    QMetaType::convert(QVar4,pPVar9,(QMetaType)local_78.shared,&local_80);
    QVar4.d_ptr = local_80.d_ptr;
  }
  ::QVariant::~QVariant((QVariant *)local_58);
  if (QVar4.d_ptr == (QMetaTypeInterface *)0x0) {
    QVar4.d_ptr = (QMetaTypeInterface *)operator_new(0x48);
    (QVar4.d_ptr)->revision = 0;
    (QVar4.d_ptr)->alignment = 0;
    (QVar4.d_ptr)->size = 0;
    ((Representation *)&(QVar4.d_ptr)->flags)->m_i = -1;
    ((QVar4.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i = -1;
    (((QSize *)&(QVar4.d_ptr)->metaObjectFn)->wd).m_i = -1;
    (((QSize *)&(QVar4.d_ptr)->metaObjectFn)->ht).m_i = -1;
    QPixmapCache::Key::Key((Key *)&(QVar4.d_ptr)->name);
    *(undefined1 (*) [16])&(QVar4.d_ptr)->moveCtr = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&(QVar4.d_ptr)->defaultCtr = (undefined1  [16])0x0;
    *(bool *)&(QVar4.d_ptr)->equals = false;
    local_80.d_ptr = QVar4.d_ptr;
    if (_DAT_00831fa4 == 0) {
      QMetaType::registerHelper
                ((QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType);
    }
    ::QVariant::moveConstruct
              ((QMetaTypeInterface *)&local_78,
               &QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType);
    uVar1 = (this->extras).d.size;
    if (uVar1 != 0) {
      pEVar7 = (this->extras).d.ptr;
      uVar6 = 0;
      do {
        if (pEVar7->type == ExtraCacheData) {
          pEVar5 = QList<QGraphicsItemPrivate::ExtraStruct>::data(&this->extras);
          ::QVariant::operator=(&pEVar5[uVar6 & 0xffffffff].value,(QVariant *)&local_78);
          goto LAB_005dac37;
        }
        uVar6 = uVar6 + 1;
        pEVar7 = pEVar7 + 1;
      } while (uVar1 != uVar6);
    }
    local_58._0_4_ = 2;
    ::QVariant::QVariant((QVariant *)(local_58 + 8),(QVariant *)&local_78);
    QtPrivate::QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct>::
    emplace<QGraphicsItemPrivate::ExtraStruct>
              ((QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct> *)&this->extras,
               (this->extras).d.size,(ExtraStruct *)local_58);
    QList<QGraphicsItemPrivate::ExtraStruct>::end(&this->extras);
    ::QVariant::~QVariant((QVariant *)(local_58 + 8));
LAB_005dac37:
    ::QVariant::~QVariant((QVariant *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QGraphicsItemCache *)QVar4.d_ptr;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItemCache *QGraphicsItemPrivate::extraItemCache() const
{
    QGraphicsItemCache *c = (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
    if (!c) {
        QGraphicsItemPrivate *that = const_cast<QGraphicsItemPrivate *>(this);
        c = new QGraphicsItemCache;
        that->setExtra(ExtraCacheData, QVariant::fromValue<void *>(c));
    }
    return c;
}